

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall
edition_unittest::TestMixedFieldsAndExtensions::Clear(TestMixedFieldsAndExtensions *this)

{
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&(this->field_0)._impl_.b_);
  (this->field_0)._impl_.a_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestMixedFieldsAndExtensions::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestMixedFieldsAndExtensions)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.b_.Clear();
  _impl_.a_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}